

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

ON_OBSOLETE_V5_DimLinear *
ON_OBSOLETE_V5_DimLinear::CreateFromV2LinearDimension
          (ON_OBSOLETE_V2_DimLinear *V2_linear_dimension,ON_3dmAnnotationContext *annotation_context
          ,ON_OBSOLETE_V5_DimLinear *destination)

{
  if (destination == (ON_OBSOLETE_V5_DimLinear *)0x0) {
    destination = (ON_OBSOLETE_V5_DimLinear *)operator_new(0xe0);
    ON_OBSOLETE_V5_DimLinear(destination);
  }
  ON_OBSOLETE_V5_Annotation::Internal_InitializeFromV2Annotation
            (&destination->super_ON_OBSOLETE_V5_Annotation,
             &V2_linear_dimension->super_ON_OBSOLETE_V2_Annotation,annotation_context);
  return (ON_OBSOLETE_V5_DimLinear *)&destination->super_ON_OBSOLETE_V5_Annotation;
}

Assistant:

ON_OBSOLETE_V5_DimLinear* ON_OBSOLETE_V5_DimLinear::CreateFromV2LinearDimension( 
  const class ON_OBSOLETE_V2_DimLinear& V2_linear_dimension,
  const ON_3dmAnnotationContext* annotation_context,
  ON_OBSOLETE_V5_DimLinear* destination
  )
{
  ON_OBSOLETE_V5_DimLinear* V5_linear_dimension
    = (nullptr != destination)
    ? destination
    : new ON_OBSOLETE_V5_DimLinear();

  V5_linear_dimension->Internal_InitializeFromV2Annotation(V2_linear_dimension,annotation_context);

  return V5_linear_dimension;
}